

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_1u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  ulong uVar2;
  OPJ_UINT32 val_1;
  OPJ_UINT32 val;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val_1 = 0; _val_1 < (length & 0xfffffffffffffff8); _val_1 = _val_1 + 8) {
    bVar1 = (byte)*pDst_local;
    pDst[_val_1] = (uint)(bVar1 >> 7);
    pDst[_val_1 + 1] = bVar1 >> 6 & 1;
    pDst[_val_1 + 2] = bVar1 >> 5 & 1;
    pDst[_val_1 + 3] = bVar1 >> 4 & 1;
    pDst[_val_1 + 4] = bVar1 >> 3 & 1;
    pDst[_val_1 + 5] = bVar1 >> 2 & 1;
    pDst[_val_1 + 6] = bVar1 >> 1 & 1;
    pDst[_val_1 + 7] = bVar1 & 1;
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
  }
  if ((length & 7) != 0) {
    bVar1 = (byte)*pDst_local;
    uVar2 = length & 7;
    pDst[_val_1] = (uint)(bVar1 >> 7);
    if ((((1 < uVar2) && (pDst[_val_1 + 1] = bVar1 >> 6 & 1, 2 < uVar2)) &&
        (pDst[_val_1 + 2] = bVar1 >> 5 & 1, 3 < uVar2)) &&
       (((pDst[_val_1 + 3] = bVar1 >> 4 & 1, 4 < uVar2 &&
         (pDst[_val_1 + 4] = bVar1 >> 3 & 1, 5 < uVar2)) &&
        (pDst[_val_1 + 5] = bVar1 >> 2 & 1, 6 < uVar2)))) {
      pDst[_val_1 + 6] = bVar1 >> 1 & 1;
    }
  }
  return;
}

Assistant:

static void convert_1u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val = *pSrc++;
        pDst[i + 0] = (OPJ_INT32)(val >> 7);
        pDst[i + 1] = (OPJ_INT32)((val >> 6) & 0x1U);
        pDst[i + 2] = (OPJ_INT32)((val >> 5) & 0x1U);
        pDst[i + 3] = (OPJ_INT32)((val >> 4) & 0x1U);
        pDst[i + 4] = (OPJ_INT32)((val >> 3) & 0x1U);
        pDst[i + 5] = (OPJ_INT32)((val >> 2) & 0x1U);
        pDst[i + 6] = (OPJ_INT32)((val >> 1) & 0x1U);
        pDst[i + 7] = (OPJ_INT32)(val & 0x1U);
    }
    if (length & 7U) {
        OPJ_UINT32 val = *pSrc++;
        length = length & 7U;
        pDst[i + 0] = (OPJ_INT32)(val >> 7);

        if (length > 1U) {
            pDst[i + 1] = (OPJ_INT32)((val >> 6) & 0x1U);
            if (length > 2U) {
                pDst[i + 2] = (OPJ_INT32)((val >> 5) & 0x1U);
                if (length > 3U) {
                    pDst[i + 3] = (OPJ_INT32)((val >> 4) & 0x1U);
                    if (length > 4U) {
                        pDst[i + 4] = (OPJ_INT32)((val >> 3) & 0x1U);
                        if (length > 5U) {
                            pDst[i + 5] = (OPJ_INT32)((val >> 2) & 0x1U);
                            if (length > 6U) {
                                pDst[i + 6] = (OPJ_INT32)((val >> 1) & 0x1U);
                            }
                        }
                    }
                }
            }
        }
    }
}